

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

int __thiscall
google::protobuf::internal::GeneratedMessageReflection::FieldSize
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  Label LVar2;
  int number;
  CppType CVar3;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  RepeatedField<long> *this_01;
  RepeatedField<unsigned_int> *this_02;
  RepeatedField<unsigned_long> *this_03;
  RepeatedField<double> *this_04;
  RepeatedField<float> *this_05;
  RepeatedField<bool> *this_06;
  RepeatedField<int> *pRVar5;
  MapFieldBase *this_07;
  RepeatedPtrFieldBase *pRVar6;
  LogMessage *other;
  LogFinisher local_6d [13];
  LogMessage local_60;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,local_28,"FieldSize","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(local_28);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,local_28,"FieldSize",
               "Field is singular; the method requires a repeated field.");
  }
  bVar1 = FieldDescriptor::is_extension(local_28);
  if (bVar1) {
    this_00 = GetExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number(local_28);
    this_local._4_4_ = ExtensionSet::ExtensionSize(this_00,number);
  }
  else {
    CVar3 = FieldDescriptor::cpp_type(local_28);
    switch(CVar3) {
    case CPPTYPE_INT32:
      pRVar5 = GetRaw<google::protobuf::RepeatedField<int>>(this,(Message *)field_local,local_28);
      this_local._4_4_ = RepeatedField<int>::size(pRVar5);
      break;
    case CPPTYPE_INT64:
      this_01 = GetRaw<google::protobuf::RepeatedField<long>>(this,(Message *)field_local,local_28);
      this_local._4_4_ = RepeatedField<long>::size(this_01);
      break;
    case CPPTYPE_UINT32:
      this_02 = GetRaw<google::protobuf::RepeatedField<unsigned_int>>
                          (this,(Message *)field_local,local_28);
      this_local._4_4_ = RepeatedField<unsigned_int>::size(this_02);
      break;
    case CPPTYPE_UINT64:
      this_03 = GetRaw<google::protobuf::RepeatedField<unsigned_long>>
                          (this,(Message *)field_local,local_28);
      this_local._4_4_ = RepeatedField<unsigned_long>::size(this_03);
      break;
    case CPPTYPE_DOUBLE:
      this_04 = GetRaw<google::protobuf::RepeatedField<double>>
                          (this,(Message *)field_local,local_28);
      this_local._4_4_ = RepeatedField<double>::size(this_04);
      break;
    case CPPTYPE_FLOAT:
      this_05 = GetRaw<google::protobuf::RepeatedField<float>>(this,(Message *)field_local,local_28)
      ;
      this_local._4_4_ = RepeatedField<float>::size(this_05);
      break;
    case CPPTYPE_BOOL:
      this_06 = GetRaw<google::protobuf::RepeatedField<bool>>(this,(Message *)field_local,local_28);
      this_local._4_4_ = RepeatedField<bool>::size(this_06);
      break;
    case CPPTYPE_ENUM:
      pRVar5 = GetRaw<google::protobuf::RepeatedField<int>>(this,(Message *)field_local,local_28);
      this_local._4_4_ = RepeatedField<int>::size(pRVar5);
      break;
    case CPPTYPE_STRING:
    case CPPTYPE_MESSAGE:
      bVar1 = anon_unknown_0::IsMapFieldInApi(local_28);
      if (bVar1) {
        this_07 = GetRaw<google::protobuf::internal::MapFieldBase>
                            (this,(Message *)field_local,local_28);
        pRVar6 = MapFieldBase::GetRepeatedField(this_07);
        this_local._4_4_ = RepeatedPtrFieldBase::size(pRVar6);
      }
      else {
        pRVar6 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                           (this,(Message *)field_local,local_28);
        this_local._4_4_ = RepeatedPtrFieldBase::size(pRVar6);
      }
      break;
    default:
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x2fd);
      other = LogMessage::operator<<(&local_60,"Can\'t get here.");
      LogFinisher::operator=(local_6d,other);
      LogMessage::~LogMessage(&local_60);
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int GeneratedMessageReflection::FieldSize(const Message& message,
                                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(FieldSize);
  USAGE_CHECK_REPEATED(FieldSize);

  if (field->is_extension()) {
    return GetExtensionSet(message).ExtensionSize(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
      case FieldDescriptor::CPPTYPE_##UPPERCASE :                             \
        return GetRaw<RepeatedField<LOWERCASE> >(message, field).size()

      HANDLE_TYPE( INT32,  int32);
      HANDLE_TYPE( INT64,  int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE( FLOAT,  float);
      HANDLE_TYPE(  BOOL,   bool);
      HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          return GetRaw<MapFieldBase>(message, field).GetRepeatedField().size();
        } else {
          return GetRaw<RepeatedPtrFieldBase>(message, field).size();
        }
    }

    GOOGLE_LOG(FATAL) << "Can't get here.";
    return 0;
  }
}